

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pc-identifiers.c
# Opt level: O1

FUNCTION_RETURN
generate_pc_id(PcIdentifier *identifiers,uint *array_size,IDENTIFICATION_STRATEGY strategy)

{
  uint uVar1;
  uint uVar2;
  FUNCTION_RETURN FVar3;
  FUNCTION_RETURN FVar4;
  OsAdapterInfo *adapterInfos;
  DiskInfo *diskInfos;
  ulong uVar5;
  uchar *puVar6;
  ulong uVar7;
  _Bool use_label;
  PcIdentifier *pauVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  size_t adapter_num;
  ulong local_68;
  OsAdapterInfo *local_60;
  ulong local_58;
  ulong local_50;
  uchar *local_48;
  uchar *local_40;
  DiskInfo *local_38;
  
  if (DISK_LABEL < strategy) {
    return FUNC_RET_ERROR;
  }
  uVar1 = *array_size;
  switch(strategy) {
  case DEFAULT:
    if (uVar1 == 0 || identifiers == (PcIdentifier *)0x0) {
      FVar4 = getAdapterInfos((OsAdapterInfo *)0x0,&local_68);
      if ((FVar4 != FUNC_RET_OK) || (local_68 == 0)) goto switchD_0020c59f_caseD_3;
      FVar4 = FUNC_RET_OK;
      FVar3 = getDiskInfos((DiskInfo *)0x0,&local_50);
      if (local_50 != 0 && FVar3 == FUNC_RET_OK) {
        *array_size = (int)local_50 * (int)local_68;
        break;
      }
    }
    else {
      adapterInfos = (OsAdapterInfo *)malloc((ulong)uVar1 * 0x414);
      local_68 = (ulong)uVar1;
      FVar4 = getAdapterInfos(adapterInfos,&local_68);
      if ((FVar4 != FUNC_RET_OK) && (FVar4 != FUNC_RET_BUFFER_TOO_SMALL)) {
        free(adapterInfos);
        goto switchD_0020c59f_caseD_3;
      }
      uVar2 = *array_size;
      diskInfos = (DiskInfo *)malloc((ulong)uVar2 * 0x20c);
      local_50 = (ulong)uVar2;
      FVar4 = getDiskInfos(diskInfos,&local_50);
      if ((FVar4 == FUNC_RET_OK) || (FVar4 == FUNC_RET_BUFFER_TOO_SMALL)) {
        local_58 = local_50;
        if (local_50 == 0) {
          FVar4 = FUNC_RET_OK;
        }
        else {
          uVar2 = *array_size;
          local_40 = adapterInfos->mac_address + 2;
          local_48 = diskInfos->disk_sn + 2;
          uVar5 = 0;
          uVar7 = 0;
          do {
            local_60 = adapterInfos;
            if (local_68 != 0) {
              pauVar8 = identifiers + uVar5;
              uVar9 = 0;
              puVar6 = local_40;
              do {
                if ((ulong)uVar2 <= uVar9 + (uint)((int)uVar7 * (int)local_68)) {
                  FVar4 = FUNC_RET_BUFFER_TOO_SMALL;
                  goto LAB_0020c7fc;
                }
                lVar10 = 0;
                do {
                  (*pauVar8)[lVar10] = puVar6[lVar10] ^ local_48[lVar10 + uVar7 * 0x20c];
                  lVar10 = lVar10 + 1;
                } while (lVar10 != 6);
                uVar9 = uVar9 + 1;
                pauVar8 = pauVar8 + 1;
                puVar6 = puVar6 + 0x414;
              } while (uVar9 != local_68);
            }
            uVar7 = (ulong)((int)uVar7 + 1);
            uVar5 = (ulong)(uint)((int)uVar5 + (int)local_68);
          } while (uVar7 < local_50);
          FVar4 = FUNC_RET_OK;
        }
LAB_0020c7fc:
        uVar5 = local_50 * local_68;
        if ((ulong)*array_size <= local_50 * local_68) {
          uVar5 = (ulong)*array_size;
        }
        *array_size = (uint)uVar5;
        local_38 = diskInfos;
        free(diskInfos);
        free(adapterInfos);
        break;
      }
      free(diskInfos);
      free(adapterInfos);
    }
  case ETHERNET:
    iVar11 = 1;
LAB_0020c781:
    FVar4 = generate_ethernet_pc_id(identifiers,array_size,iVar11);
    break;
  case IP_ADDRESS:
    iVar11 = 0;
    goto LAB_0020c781;
  case DISK_NUM:
switchD_0020c59f_caseD_3:
    use_label = false;
    goto LAB_0020c74f;
  case DISK_LABEL:
    use_label = true;
LAB_0020c74f:
    FVar4 = generate_disk_pc_id(identifiers,array_size,use_label);
  }
  if ((identifiers != (PcIdentifier *)0x0) && (FVar4 == FUNC_RET_OK)) {
    uVar5 = (ulong)*array_size;
    if (*array_size != 0) {
      uVar7 = 0;
      pauVar8 = identifiers;
      do {
        (*pauVar8)[0] = (*pauVar8)[0] & 0xf | (char)strategy << 5;
        uVar7 = uVar7 + 1;
        uVar5 = (ulong)*array_size;
        pauVar8 = pauVar8 + 1;
      } while (uVar7 < uVar5);
    }
    if ((uint)uVar5 < uVar1) {
      iVar11 = uVar1 - (uint)uVar5;
      puVar6 = identifiers[uVar5] + 1;
      do {
        (*(PcIdentifier *)(puVar6 + -1))[0] = 0xc0;
        builtin_memcpy(puVar6,"*****",5);
        puVar6 = puVar6 + 6;
        iVar11 = iVar11 + -1;
      } while (iVar11 != 0);
    }
  }
  return FVar4;
}

Assistant:

FUNCTION_RETURN generate_pc_id(PcIdentifier * identifiers,
		unsigned int * array_size, IDENTIFICATION_STRATEGY strategy) {
	FUNCTION_RETURN result;
	unsigned int i, j;
	const unsigned int original_array_size = *array_size;
	unsigned char strategy_num;
	switch (strategy) {
	case DEFAULT:
		result = generate_default_pc_id(identifiers, array_size);
		break;
	case ETHERNET:
		result = generate_ethernet_pc_id(identifiers, array_size, true);
		break;
	case IP_ADDRESS:
		result = generate_ethernet_pc_id(identifiers, array_size, false);
		break;
	case DISK_NUM:
		result = generate_disk_pc_id(identifiers, array_size, false);
		break;
	case DISK_LABEL:
		result = generate_disk_pc_id(identifiers, array_size, true);
		break;
	default:
		return FUNC_RET_ERROR;
	}

	if (result == FUNC_RET_OK && identifiers != NULL) {
		strategy_num = strategy << 5;
		for (i = 0; i < *array_size; i++) {
			//encode strategy in the first three bits of the pc_identifier
			identifiers[i][0] = (identifiers[i][0] & 15) | strategy_num;
		}
		//fill array if larger
		for (i = *array_size; i < original_array_size; i++) {
			identifiers[i][0] = STRATEGY_UNKNOWN << 5;
			for (j = 1; j < sizeof(PcIdentifier); j++) {
				identifiers[i][j] = 42; //padding
			}
		}
	}
	return result;
}